

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O0

void sigfiddle_print(t_sigfiddle *x)

{
  t_sigfiddle *x_local;
  
  post("npoints %d,",(ulong)(uint)(x->x_hop << 1));
  post("amp-range %f %f,",(double)x->x_amplo,(double)x->x_amphi);
  post("reattack %d %f,",(double)x->x_attackthresh,(ulong)(uint)x->x_attacktime);
  post("vibrato %d %f",(double)x->x_vibdepth,(ulong)(uint)x->x_vibtime);
  post("npartial %f",(double)x->x_npartial);
  post("auto %d",(ulong)(uint)x->x_auto);
  return;
}

Assistant:

void sigfiddle_print(t_sigfiddle *x)
{
    post("npoints %d,",  2 * x->x_hop);
    post("amp-range %f %f,",  x->x_amplo, x->x_amphi);
    post("reattack %d %f,",  x->x_attacktime, x->x_attackthresh);
    post("vibrato %d %f",  x->x_vibtime, x->x_vibdepth);
    post("npartial %f",  x->x_npartial);
    post("auto %d",  x->x_auto);
}